

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateConstructorBody
          (MessageGenerator *this,Printer *printer,vector<bool,_std::allocator<bool>_> *processed,
          bool copy_constructor)

{
  FieldDescriptor *field_00;
  bool bVar1;
  Type TVar2;
  mapped_type *pmVar3;
  pointer ppFVar4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  FieldGenerator *pFVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  int iVar11;
  ulong uVar12;
  FieldDescriptor *last_start;
  FieldDescriptor *field;
  string pod_template;
  string first_field_name;
  string last_field_name;
  RunMap runs;
  key_type local_e8;
  cpp *local_e0;
  FieldGeneratorMap *local_d8;
  Printer *local_d0;
  char *local_c8;
  undefined8 local_c0;
  char local_b8;
  undefined7 uStack_b7;
  string local_a8;
  string local_88;
  _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_e8 = (FieldDescriptor *)0x0;
  local_d0 = printer;
  std::
  _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_68,0,(hash<const_google::protobuf::FieldDescriptor_*> *)&local_c8,
               (key_equal *)&local_a8,(allocator_type *)&local_88);
  ppFVar4 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar4) {
    uVar12 = 0;
    do {
      field_00 = ppFVar4[uVar12];
      if (copy_constructor) {
        bVar1 = anon_unknown_0::IsPOD(field_00);
        if (!bVar1) {
          if (!copy_constructor) goto LAB_0025ecf5;
          goto LAB_0025ed3c;
        }
LAB_0025ed01:
        if (local_e8 == (FieldDescriptor *)0x0) {
          local_e8 = field_00;
        }
        pmVar3 = std::__detail::
                 _Map_base<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_68,&local_e8);
        *pmVar3 = *pmVar3 + 1;
      }
      else {
LAB_0025ecf5:
        bVar1 = anon_unknown_0::CanInitializeByZeroing(field_00);
        if ((bVar1) ||
           ((*(int *)(field_00 + 0x4c) != 3 &&
            (TVar2 = FieldDescriptor::type(field_00),
            *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) == 10))))
        goto LAB_0025ed01;
LAB_0025ed3c:
        local_e8 = (FieldDescriptor *)0x0;
      }
      uVar12 = uVar12 + 1;
      ppFVar4 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(this->optimized_order_).
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3)
            );
  }
  local_c8 = &local_b8;
  local_c0 = 0;
  local_b8 = '\0';
  pcVar8 = 
  "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n"
  ;
  if (copy_constructor) {
    pcVar8 = 
    "::memcpy(&$first$_, &from.$first$_,\n  reinterpret_cast<char*>(&$last$_) -\n  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n"
    ;
  }
  std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)0x0,(ulong)pcVar8);
  ppFVar4 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar4) {
    local_d8 = &this->field_generators_;
    uVar12 = 0;
    iVar11 = 0;
    do {
      uVar9 = uVar12 + 0x3f;
      if (-1 < (long)uVar12) {
        uVar9 = uVar12;
      }
      if (((processed->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar9 >> 6) +
            (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar12 & 0x3f) & 1) == 0) {
        local_e0 = (cpp *)ppFVar4[uVar12];
        p_Var5 = std::
                 _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::_M_find_before_node
                           (&local_68,(ulong)local_e0 % local_68._M_bucket_count,
                            (key_type *)&local_e0,(__hash_code)local_e0);
        if (p_Var5 == (__node_base_ptr)0x0) {
          p_Var6 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var6 = p_Var5->_M_nxt;
        }
        if ((p_Var6 == (_Hash_node_base *)0x0) ||
           (p_Var6 = p_Var6[2]._M_nxt, p_Var6 < (_Hash_node_base *)0x2)) {
          if (copy_constructor) {
            pFVar7 = FieldGeneratorMap::get(local_d8,(FieldDescriptor *)local_e0);
            lVar10 = 0x60;
          }
          else {
            pFVar7 = FieldGeneratorMap::get(local_d8,(FieldDescriptor *)local_e0);
            lVar10 = 0x70;
          }
          (**(code **)((long)pFVar7->_vptr_FieldGenerator + lVar10))(pFVar7,local_d0);
        }
        else {
          FieldName_abi_cxx11_(&local_a8,local_e0,field_01);
          FieldName_abi_cxx11_
                    (&local_88,
                     (cpp *)(this->optimized_order_).
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)p_Var6 + (uVar12 - 1)],
                     field_02);
          io::Printer::Print(local_d0,local_c8,"first",&local_a8,"last",&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          iVar11 = iVar11 + (int)p_Var6 + -1;
        }
      }
      iVar11 = iVar11 + 1;
      uVar12 = (ulong)iVar11;
      ppFVar4 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(this->optimized_order_).
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3)
            );
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  std::
  _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void MessageGenerator::GenerateConstructorBody(io::Printer* printer,
                                               std::vector<bool> processed,
                                               bool copy_constructor) const {
  const FieldDescriptor* last_start = NULL;
  // RunMap maps from fields that start each run to the number of fields in that
  // run.  This is optimized for the common case that there are very few runs in
  // a message and that most of the eligible fields appear together.
  typedef hash_map<const FieldDescriptor*, size_t> RunMap;
  RunMap runs;

  for (int i = 0; i < optimized_order_.size(); ++i) {
    const FieldDescriptor* field = optimized_order_[i];
    if ((copy_constructor && IsPOD(field)) ||
        (!copy_constructor && CanConstructByZeroing(field, options_))) {
      if (last_start == NULL) {
        last_start = field;
      }

      runs[last_start]++;
    } else {
      last_start = NULL;
    }
  }

  string pod_template;
  if (copy_constructor) {
    pod_template =
        "::memcpy(&$first$_, &from.$first$_,\n"
        "  reinterpret_cast<char*>(&$last$_) -\n"
        "  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n";
  } else {
    pod_template =
        "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n"
        "  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n";
  }

  for (int i = 0; i < optimized_order_.size(); ++i) {
    if (processed[i]) {
      continue;
    }

    const FieldDescriptor* field = optimized_order_[i];
    RunMap::const_iterator it = runs.find(field);

    // We only apply the memset technique to runs of more than one field, as
    // assignment is better than memset for generated code clarity.
    if (it != runs.end() && it->second > 1) {
      // Use a memset, then skip run_length fields.
      const size_t run_length = it->second;
      const string first_field_name = FieldName(field);
      const string last_field_name =
          FieldName(optimized_order_[i + run_length - 1]);

      printer->Print(pod_template.c_str(),
        "first", first_field_name,
        "last", last_field_name);

      i += run_length - 1;
      // ++i at the top of the loop.
    } else {
      if (copy_constructor) {
        field_generators_.get(field).GenerateCopyConstructorCode(printer);
      } else {
        field_generators_.get(field).GenerateConstructorCode(printer);
      }
    }
  }
}